

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_toggle.c
# Opt level: O2

void * toggle_new(t_symbol *s,int argc,t_atom *argv)

{
  t_iem_fstyle_flags tVar1;
  bool bVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  t_iemgui *iemgui;
  _glist *p_Var6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  t_float tVar10;
  t_float tVar11;
  float fVar12;
  float fVar13;
  undefined8 local_88;
  t_iemgui_drawfunctions local_68;
  
  iemgui = iemgui_new(toggle_class);
  p_Var6 = canvas_getcurrent();
  iVar4 = sys_zoomfontheight(p_Var6->gl_font,1,0);
  p_Var6 = canvas_getcurrent();
  iVar5 = sys_zoomfontheight(p_Var6->gl_font,1,0);
  iVar9 = iemgui->x_fontsize;
  local_68.draw_new = toggle_draw_new;
  local_68.draw_config = toggle_draw_config;
  local_68.draw_iolets = (t_iemfunptr)0x0;
  local_68.draw_update = toggle_draw_update;
  local_68.draw_select = toggle_draw_select;
  local_68.draw_erase = (t_iemdrawfunptr)0x0;
  local_68.draw_move = (t_iemdrawfunptr)0x0;
  iemgui_setdrawfunctions(iemgui,&local_68);
  if ((((((argc - 0xdU < 2) && (argv->a_type == A_FLOAT)) && (argv[1].a_type == A_FLOAT)) &&
       ((argv[2].a_type - A_FLOAT < 2 && (argv[3].a_type - A_FLOAT < 2)))) &&
      ((argv[4].a_type - A_FLOAT < 2 && ((argv[5].a_type == A_FLOAT && (argv[6].a_type == A_FLOAT)))
       ))) && ((argv[7].a_type == A_FLOAT &&
               ((argv[8].a_type == A_FLOAT && (argv[0xc].a_type == A_FLOAT)))))) {
    tVar10 = atom_getfloatarg(0,argc,argv);
    iVar4 = (int)tVar10;
    tVar10 = atom_getfloatarg(1,argc,argv);
    iem_inttosymargs(&iemgui->x_isa,(int)tVar10);
    iemgui_new_getnames(iemgui,2,argv);
    tVar10 = atom_getfloatarg(5,argc,argv);
    tVar11 = atom_getfloatarg(6,argc,argv);
    local_88 = CONCAT44((int)tVar11,(int)tVar10);
    tVar10 = atom_getfloatarg(7,argc,argv);
    iem_inttofstyle(&iemgui->x_fsf,(int)tVar10);
    tVar10 = atom_getfloatarg(8,argc,argv);
    iVar9 = (int)tVar10;
    iemgui_all_loadcolors(iemgui,argv + 9,argv + 10,argv + 0xb);
    tVar10 = atom_getfloatarg(0xc,argc,argv);
    bVar2 = tVar10 != 0.0;
  }
  else {
    iVar4 = iVar4 + 5;
    bVar2 = false;
    iemgui_new_getnames(iemgui,2,(t_atom *)0x0);
    local_88 = (ulong)(uint)(int)((double)(iVar5 * -8 + -0x28) / 15.0) << 0x20;
  }
  dVar3 = 1.0;
  if ((argc == 0xe) && (dVar3 = 1.0, argv[0xd].a_type == A_FLOAT)) {
    tVar10 = atom_getfloatarg(0xd,0xe,argv);
    dVar3 = (double)tVar10;
  }
  tVar1 = iemgui->x_fsf;
  uVar7 = (uint)(iemgui->x_snd != (t_symbol *)0x0) << 7;
  uVar8 = (uint)(iemgui->x_rcv != (t_symbol *)0x0) << 6;
  iemgui->x_fsf = (t_iem_fstyle_flags)(uVar8 | (uint)tVar1 & 0xffffff3f | uVar7);
  if (((uint)tVar1 & 0x3f) == 2) {
    builtin_strncpy(iemgui->x_font,"times",6);
  }
  else if (((uint)tVar1 & 0x3f) == 1) {
    builtin_strncpy(iemgui->x_font,"helvetica",10);
  }
  else {
    iemgui->x_fsf = (t_iem_fstyle_flags)(uVar8 | (uint)tVar1 & 0xffffff00 | uVar7);
    strcpy(iemgui->x_font,sys_font);
  }
  *(float *)((long)&iemgui[1].x_obj.te_g.g_pd + 4) =
       (float)(double)(~-(ulong)(dVar3 != 0.0) & 0x3ff0000000000000 |
                      -(ulong)(dVar3 != 0.0) & (ulong)dVar3);
  if (bVar2) {
    fVar13 = (float)dVar3;
  }
  else {
    fVar13 = 0.0;
  }
  fVar12 = 0.0;
  if (((uint)iemgui->x_isa & 1) != 0) {
    fVar12 = fVar13;
  }
  *(float *)&iemgui[1].x_obj.te_g.g_pd = fVar12;
  if (((uint)iemgui->x_fsf & 0x40) != 0) {
    pd_bind((t_pd *)iemgui,iemgui->x_rcv);
  }
  iemgui->x_ldx = (undefined4)local_88;
  iemgui->x_ldy = local_88._4_4_;
  iVar5 = 4;
  if (4 < iVar9) {
    iVar5 = iVar9;
  }
  iemgui->x_fontsize = iVar5;
  iVar9 = iemgui_clip_size(iVar4);
  iemgui->x_w = iVar9;
  iemgui->x_h = iVar9;
  iemgui_verify_snd_ne_rcv(iemgui);
  iemgui_newzoom(iemgui);
  outlet_new(&iemgui->x_obj,&s_float);
  return iemgui;
}

Assistant:

static void *toggle_new(t_symbol *s, int argc, t_atom *argv)
{
    t_toggle *x = (t_toggle *)iemgui_new(toggle_class);
    int a = IEM_GUI_DEFAULTSIZE, f = 0;
    int ldx = 0, ldy = -8 * IEM_GUI_DEFAULTSIZE_SCALE;
    int fs = x->x_gui.x_fontsize;
    t_float on = 0.0, nonzero = 1.0;
    char str[144];

    IEMGUI_SETDRAWFUNCTIONS(x, toggle);

    if(((argc == 13)||(argc == 14))&&IS_A_FLOAT(argv,0)
       &&IS_A_FLOAT(argv,1)
       &&(IS_A_SYMBOL(argv,2)||IS_A_FLOAT(argv,2))
       &&(IS_A_SYMBOL(argv,3)||IS_A_FLOAT(argv,3))
       &&(IS_A_SYMBOL(argv,4)||IS_A_FLOAT(argv,4))
       &&IS_A_FLOAT(argv,5)&&IS_A_FLOAT(argv,6)
       &&IS_A_FLOAT(argv,7)&&IS_A_FLOAT(argv,8)&&IS_A_FLOAT(argv,12))
    {
        a = (int)atom_getfloatarg(0, argc, argv);
        iem_inttosymargs(&x->x_gui.x_isa, atom_getfloatarg(1, argc, argv));
        iemgui_new_getnames(&x->x_gui, 2, argv);
        ldx = (int)atom_getfloatarg(5, argc, argv);
        ldy = (int)atom_getfloatarg(6, argc, argv);
        iem_inttofstyle(&x->x_gui.x_fsf, atom_getfloatarg(7, argc, argv));
        fs = (int)atom_getfloatarg(8, argc, argv);
        iemgui_all_loadcolors(&x->x_gui, argv+9, argv+10, argv+11);
        on = (t_float)atom_getfloatarg(12, argc, argv);
    }
    else iemgui_new_getnames(&x->x_gui, 2, 0);
    if((argc == 14)&&IS_A_FLOAT(argv,13))
        nonzero = (t_float)atom_getfloatarg(13, argc, argv);

    x->x_gui.x_fsf.x_snd_able = (0 != x->x_gui.x_snd);
    x->x_gui.x_fsf.x_rcv_able = (0 != x->x_gui.x_rcv);
    if(x->x_gui.x_fsf.x_font_style == 1) strcpy(x->x_gui.x_font, "helvetica");
    else if(x->x_gui.x_fsf.x_font_style == 2) strcpy(x->x_gui.x_font, "times");
    else { x->x_gui.x_fsf.x_font_style = 0;
        strcpy(x->x_gui.x_font, sys_font); }
    x->x_nonzero = (nonzero != 0.0) ? nonzero : 1.0;
    if(x->x_gui.x_isa.x_loadinit)
        x->x_on = (on != 0.0) ? nonzero : 0.0;
    else
        x->x_on = 0.0;
    if (x->x_gui.x_fsf.x_rcv_able)
        pd_bind(&x->x_gui.x_obj.ob_pd, x->x_gui.x_rcv);
    x->x_gui.x_ldx = ldx;
    x->x_gui.x_ldy = ldy;
    x->x_gui.x_fontsize = (fs < 4)?4:fs;
    x->x_gui.x_w = iemgui_clip_size(a);
    x->x_gui.x_h = x->x_gui.x_w;
    iemgui_verify_snd_ne_rcv(&x->x_gui);
    iemgui_newzoom(&x->x_gui);
    outlet_new(&x->x_gui.x_obj, &s_float);
    return (x);
}